

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O1

void __thiscall llama_vocab::impl::init_tokenizer(impl *this,llama_vocab_type type)

{
  llama_vocab *plVar1;
  llm_tokenizer_ugm *this_00;
  llm_tokenizer *plVar2;
  undefined *puVar3;
  llm_tokenizer *plVar4;
  
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: initializing tokenizer for type %d\n",
                     "init_tokenizer",(ulong)type);
  switch(type) {
  case LLAMA_VOCAB_TYPE_SPM:
    plVar2 = (llm_tokenizer *)operator_new(8);
    puVar3 = &llm_tokenizer_spm::vtable;
    goto LAB_0021633b;
  case LLAMA_VOCAB_TYPE_BPE:
    plVar1 = this->vocab;
    this_00 = (llm_tokenizer_ugm *)operator_new(0x20);
    llm_tokenizer_bpe::llm_tokenizer_bpe((llm_tokenizer_bpe *)this_00,plVar1);
    break;
  case LLAMA_VOCAB_TYPE_WPM:
    plVar2 = (llm_tokenizer *)operator_new(8);
    puVar3 = &llm_tokenizer_wpm::vtable;
LAB_0021633b:
    plVar2->_vptr_llm_tokenizer = (_func_int **)(puVar3 + 0x10);
    plVar4 = (this->tokenizer)._M_t.
             super___uniq_ptr_impl<llm_tokenizer,_std::default_delete<llm_tokenizer>_>._M_t.
             super__Tuple_impl<0UL,_llm_tokenizer_*,_std::default_delete<llm_tokenizer>_>.
             super__Head_base<0UL,_llm_tokenizer_*,_false>._M_head_impl;
    (this->tokenizer)._M_t.super___uniq_ptr_impl<llm_tokenizer,_std::default_delete<llm_tokenizer>_>
    ._M_t.super__Tuple_impl<0UL,_llm_tokenizer_*,_std::default_delete<llm_tokenizer>_>.
    super__Head_base<0UL,_llm_tokenizer_*,_false>._M_head_impl = plVar2;
    goto LAB_002163aa;
  case LLAMA_VOCAB_TYPE_UGM:
    plVar1 = this->vocab;
    this_00 = (llm_tokenizer_ugm *)operator_new(200);
    llm_tokenizer_ugm::llm_tokenizer_ugm(this_00,plVar1,&this->precompiled_charsmap);
    break;
  case LLAMA_VOCAB_TYPE_RWKV:
    plVar1 = this->vocab;
    this_00 = (llm_tokenizer_ugm *)operator_new(0x40);
    llm_tokenizer_rwkv::llm_tokenizer_rwkv((llm_tokenizer_rwkv *)this_00,plVar1);
    break;
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
               ,0x88f,"unsupported vocab type");
  }
  plVar4 = (this->tokenizer)._M_t.
           super___uniq_ptr_impl<llm_tokenizer,_std::default_delete<llm_tokenizer>_>._M_t.
           super__Tuple_impl<0UL,_llm_tokenizer_*,_std::default_delete<llm_tokenizer>_>.
           super__Head_base<0UL,_llm_tokenizer_*,_false>._M_head_impl;
  (this->tokenizer)._M_t.super___uniq_ptr_impl<llm_tokenizer,_std::default_delete<llm_tokenizer>_>.
  _M_t.super__Tuple_impl<0UL,_llm_tokenizer_*,_std::default_delete<llm_tokenizer>_>.
  super__Head_base<0UL,_llm_tokenizer_*,_false>._M_head_impl = &this_00->super_llm_tokenizer;
LAB_002163aa:
  if (plVar4 == (llm_tokenizer *)0x0) {
    return;
  }
  (*plVar4->_vptr_llm_tokenizer[1])();
  return;
}

Assistant:

void llama_vocab::impl::init_tokenizer(enum llama_vocab_type type) {
    LLAMA_LOG_DEBUG("%s: initializing tokenizer for type %d\n", __func__, type);

    switch (type) {
        case LLAMA_VOCAB_TYPE_SPM:
            tokenizer = std::make_unique<llm_tokenizer_spm>(vocab);
            break;
        case LLAMA_VOCAB_TYPE_BPE:
            tokenizer = std::make_unique<llm_tokenizer_bpe>(vocab);
            break;
        case LLAMA_VOCAB_TYPE_WPM:
            tokenizer = std::make_unique<llm_tokenizer_wpm>(vocab);
            break;
        case LLAMA_VOCAB_TYPE_UGM:
            tokenizer = std::make_unique<llm_tokenizer_ugm>(vocab, precompiled_charsmap);
            break;
        case LLAMA_VOCAB_TYPE_RWKV:
            tokenizer = std::make_unique<llm_tokenizer_rwkv>(vocab);
            break;
        default:
            GGML_ABORT("unsupported vocab type");
    }
}